

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicPlatformDebug.cpp
# Opt level: O0

char * Diligent::BasicPlatformDebug::TextColorToTextColorCode
                 (DEBUG_MESSAGE_SEVERITY Severity,TextColor Color)

{
  TextColor Color_local;
  DEBUG_MESSAGE_SEVERITY Severity_local;
  
  switch(Color) {
  case Auto:
    if (Severity == DEBUG_MESSAGE_SEVERITY_INFO) {
      _Color_local = "\x1b[39m";
    }
    else if (Severity == DEBUG_MESSAGE_SEVERITY_WARNING) {
      _Color_local = "\x1b[93m";
    }
    else if (Severity - DEBUG_MESSAGE_SEVERITY_ERROR < 2) {
      _Color_local = "\x1b[91m";
    }
    else {
      _Color_local = "\x1b[39m";
    }
    break;
  case Default:
    _Color_local = "\x1b[39m";
    break;
  case Black:
    _Color_local = "\x1b[30m";
    break;
  case DarkRed:
    _Color_local = "\x1b[31m";
    break;
  case DarkGreen:
    _Color_local = "\x1b[32m";
    break;
  case DarkYellow:
    _Color_local = "\x1b[33m";
    break;
  case DarkBlue:
    _Color_local = "\x1b[34m";
    break;
  case DarkMagenta:
    _Color_local = "\x1b[35m";
    break;
  case DarkCyan:
    _Color_local = "\x1b[36m";
    break;
  case DarkGray:
    _Color_local = "\x1b[90m";
    break;
  case Red:
    _Color_local = "\x1b[91m";
    break;
  case Green:
    _Color_local = "\x1b[92m";
    break;
  case Yellow:
    _Color_local = "\x1b[93m";
    break;
  case Blue:
    _Color_local = "\x1b[94m";
    break;
  case Magenta:
    _Color_local = "\x1b[95m";
    break;
  case Cyan:
    _Color_local = "\x1b[96m";
    break;
  case White:
    _Color_local = "\x1b[97m";
    break;
  default:
    _Color_local = "\x1b[39m";
  }
  return _Color_local;
}

Assistant:

const char* BasicPlatformDebug::TextColorToTextColorCode(DEBUG_MESSAGE_SEVERITY Severity, TextColor Color)
{
    switch (Color)
    {
        case TextColor::Auto:
        {
            switch (Severity)
            {
                case DEBUG_MESSAGE_SEVERITY_INFO:
                    return TextColorCode::Default;

                case DEBUG_MESSAGE_SEVERITY_WARNING:
                    return TextColorCode::Yellow;

                case DEBUG_MESSAGE_SEVERITY_ERROR:
                case DEBUG_MESSAGE_SEVERITY_FATAL_ERROR:
                    return TextColorCode::Red;

                default:
                    return TextColorCode::Default;
            }
        }
#define TEX_COLOR_TO_CODE(Color) \
    case TextColor::Color: return TextColorCode::Color

            TEX_COLOR_TO_CODE(Default);

            TEX_COLOR_TO_CODE(Black);
            TEX_COLOR_TO_CODE(DarkRed);
            TEX_COLOR_TO_CODE(DarkGreen);
            TEX_COLOR_TO_CODE(DarkYellow);
            TEX_COLOR_TO_CODE(DarkBlue);
            TEX_COLOR_TO_CODE(DarkMagenta);
            TEX_COLOR_TO_CODE(DarkCyan);
            TEX_COLOR_TO_CODE(DarkGray);

            TEX_COLOR_TO_CODE(Red);
            TEX_COLOR_TO_CODE(Green);
            TEX_COLOR_TO_CODE(Yellow);
            TEX_COLOR_TO_CODE(Blue);
            TEX_COLOR_TO_CODE(Magenta);
            TEX_COLOR_TO_CODE(Cyan);
            TEX_COLOR_TO_CODE(White);
#undef TEX_COLOR_TO_CODE

        default:
            return TextColorCode::Default;
    }
}